

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl.cpp
# Opt level: O0

bool __thiscall pg::DTLSolver::sptl(DTLSolver *this,bitset *V,bitset *W,bitset *R,int player)

{
  uint *__s;
  unsigned_long *__first;
  uint64_t *puVar1;
  uint uVar2;
  bitset *pbVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  ostream *poVar7;
  size_t sVar8;
  int iVar9;
  _label_vertex _Var10;
  byte local_1d9;
  byte local_179;
  undefined1 local_170 [16];
  undefined1 local_160 [16];
  undefined1 local_150 [28];
  int to;
  int *curedge;
  Game *pGStack_128;
  bool closed_region;
  int local_120;
  _label_vertex local_118;
  Game *local_108;
  int local_100;
  _label_vertex local_f8;
  uint local_e8;
  uint local_e4;
  int v_1;
  uint i;
  uint local_cc;
  undefined1 local_c8 [4];
  int v;
  undefined1 local_b8 [16];
  undefined1 local_a8 [28];
  int top;
  bool changes;
  bitset *pbStack_88;
  int player_local;
  bitset *R_local;
  bitset *W_local;
  bitset *V_local;
  DTLSolver *this_local;
  uintqueue *local_60;
  uint local_54;
  uintqueue *local_50;
  uintqueue *local_48;
  uintqueue *local_40;
  char local_31;
  bitset *local_30;
  uintqueue *local_28;
  uintqueue *local_20;
  uint local_14;
  uintqueue *local_10;
  
  local_a8[0x1b] = 0;
  top = player;
  pbStack_88 = R;
  R_local = W;
  W_local = V;
  V_local = (bitset *)this;
  lVar6 = Solver::nodecount(&this->super_Solver);
  local_a8._20_4_ = (undefined4)lVar6;
  do {
    do {
      local_a8._20_4_ = local_a8._20_4_ - 1;
      if ((int)local_a8._20_4_ < 0) {
        return (bool)(local_a8[0x1b] & 1);
      }
      bitset::operator[]((bitset *)local_a8,(size_t)W_local);
      bVar4 = bitset::reference::operator_cast_to_bool((reference *)local_a8);
      local_179 = 1;
      if (bVar4) {
        bitset::operator[]((bitset *)local_b8,(size_t)pbStack_88);
        bVar4 = bitset::reference::operator_cast_to_bool((reference *)local_b8);
        local_179 = bVar4 ^ 0xff;
      }
    } while ((local_179 & 1) != 0);
    bitset::operator[]((bitset *)local_c8,(size_t)&this->Z);
    bitset::reference::operator=((reference *)local_c8,true);
    this->str[(int)local_a8._20_4_] = -1;
    local_50 = &this->Q;
    local_54 = local_a8._20_4_;
    iVar9 = (this->Q).pointer;
    (this->Q).pointer = iVar9 + 1;
    local_50->queue[iVar9] = local_a8._20_4_;
    while (local_48 = &this->Q, (this->Q).pointer != 0) {
      local_40 = &this->Q;
      iVar9 = (this->Q).pointer + -1;
      (this->Q).pointer = iVar9;
      local_cc = local_40->queue[iVar9];
      bitset::operator[]((bitset *)&v_1,(size_t)pbStack_88);
      bitset::reference::operator=((reference *)&v_1,false);
      pbVar3 = pbStack_88;
      iVar9 = top;
      uVar2 = local_cc;
      if (1 < (this->super_Solver).trace) {
        local_60 = &this->Zvec;
        this_local._4_4_ = local_cc;
        iVar5 = (this->Zvec).pointer;
        (this->Zvec).pointer = iVar5 + 1;
        local_60->queue[iVar5] = local_cc;
      }
      iVar5 = Solver::priority(&this->super_Solver,local_a8._20_4_);
      attractVertices(this,iVar9,uVar2,pbVar3,&this->Z,pbVar3,iVar5);
      pbVar3 = pbStack_88;
      iVar9 = top;
      uVar2 = local_cc;
      iVar5 = Solver::priority(&this->super_Solver,local_a8._20_4_);
      attractTangles(this,iVar9,uVar2,pbVar3,&this->Z,pbVar3,iVar5);
    }
    if (1 < (this->super_Solver).trace) {
      poVar7 = std::operator<<((this->super_Solver).logger,"\x1b[1;33mregion\x1b[m \x1b[1;36m");
      iVar9 = Solver::priority(&this->super_Solver,local_a8._20_4_);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar9);
      std::operator<<(poVar7,"\x1b[m");
      for (local_e4 = 0; local_20 = &this->Zvec, local_e4 < (uint)(this->Zvec).pointer;
          local_e4 = local_e4 + 1) {
        local_10 = &this->Zvec;
        local_14 = local_e4;
        local_e8 = local_10->queue[local_e4];
        poVar7 = std::operator<<((this->super_Solver).logger," \x1b[1;38;5;15m");
        _Var10 = Solver::label_vertex(&this->super_Solver,local_e8);
        local_108 = _Var10.g;
        local_100 = _Var10.v;
        local_f8.g = local_108;
        local_f8.v = local_100;
        poVar7 = operator<<(poVar7,&local_f8);
        std::operator<<(poVar7,"\x1b[m");
        if (this->str[(int)local_e8] != -1) {
          poVar7 = std::operator<<((this->super_Solver).logger,"->");
          _Var10 = Solver::label_vertex(&this->super_Solver,this->str[(int)local_e8]);
          pGStack_128 = _Var10.g;
          local_120 = _Var10.v;
          local_118.g = pGStack_128;
          local_118.v = local_120;
          operator<<(poVar7,&local_118);
        }
      }
      std::ostream::operator<<((this->super_Solver).logger,std::endl<char,std::char_traits<char>>);
      local_28 = &this->Zvec;
      (this->Zvec).pointer = 0;
    }
    curedge._7_1_ = 1;
    iVar9 = Solver::owner(&this->super_Solver,local_a8._20_4_);
    if (iVar9 == top) {
      if (this->str[(int)local_a8._20_4_] == -1) {
        curedge._7_1_ = 0;
      }
    }
    else {
      for (register0x00000000 = Solver::outs(&this->super_Solver,local_a8._20_4_);
          *stack0xfffffffffffffec8 != -1; register0x00000000 = stack0xfffffffffffffec8 + 1) {
        local_150._20_4_ = *stack0xfffffffffffffec8;
        bitset::operator[]((bitset *)local_150,(size_t)pbStack_88);
        bVar4 = bitset::reference::operator_cast_to_bool((reference *)local_150);
        if (bVar4) {
          curedge._7_1_ = 0;
          break;
        }
      }
    }
    local_1d9 = 0;
    if ((curedge._7_1_ & 1) != 0) {
      bitset::operator[]((bitset *)local_160,(size_t)R_local);
      bVar4 = bitset::reference::operator_cast_to_bool((reference *)local_160);
      local_1d9 = bVar4 ^ 0xff;
    }
    if ((local_1d9 & 1) != 0) {
      bitset::operator[]((bitset *)local_170,(size_t)R_local);
      bitset::reference::operator=((reference *)local_170,true);
      __s = this->pea_vidx;
      lVar6 = Solver::nodecount(&this->super_Solver);
      memset(__s,0,lVar6 << 2);
      this->pea_curidx = 1;
      bVar4 = extractTangles(this,local_a8._20_4_,&this->Z,this->str);
      if (bVar4) {
        local_a8[0x1b] = 1;
      }
    }
    local_30 = &this->Z;
    __first = local_30->_bits;
    puVar1 = local_30->_bits;
    sVar8 = bitset::num_blocks(local_30);
    local_31 = '\0';
    std::fill<unsigned_long*,char>(__first,puVar1 + sVar8,&local_31);
  } while( true );
}

Assistant:

bool
DTLSolver::sptl(bitset &V, bitset &W, bitset &R, const int player)
{
    bool changes = false;

    for (int top=nodecount()-1; top>=0; top--) {
        if (!V[top] or !R[top]) continue; // meh

        Z[top] = true; // add to <Z>
        str[top] = -1;
        Q.push(top);

        while (Q.nonempty()) {
            const int v = Q.pop();
            R[v] = false; // remove from <R>
#ifndef NDEBUG
            if (trace >= 2) Zvec.push(v);
#endif
            attractVertices(player, v, R, Z, R, priority(top));
            attractTangles(player, v, R, Z, R, priority(top));
        }

#ifndef NDEBUG
        if (trace >= 2) {
            // report region
            logger << "\033[1;33mregion\033[m \033[1;36m" << priority(top) << "\033[m";
            for (unsigned int i=0; i<Zvec.size(); i++) {
                int v = Zvec[i];
                logger << " \033[1;38;5;15m" << label_vertex(v) << "\033[m";
                if (str[v] != -1) logger << "->" << label_vertex(str[v]);
            }
            logger << std::endl;
            Zvec.clear();
        }
#endif

        bool closed_region = true;

        if (owner(top) == player) {
            if (str[top] == -1) {
                closed_region = false;
            }
        } else {
            for (auto curedge = outs(top); *curedge != -1; curedge++) {
                int to = *curedge;
                if (R[to]) {
                    closed_region = false;
                    break;
                }
            }
        }

        if (closed_region and !W[top]) {
            W[top] = true;

            /**
             * Extract tangles by computing SCCs starting at each top vertex.
             * Note: each bottom SCC must contain a head vertex.
             */

            memset(pea_vidx, 0, sizeof(int[nodecount()]));
            pea_curidx = 1;

            if (extractTangles(top, Z, str)) changes = true;
        }

        Z.reset();
    }

    return changes;
}